

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::VectorTest_VectorContainingVectors_Test::
~VectorTest_VectorContainingVectors_Test(VectorTest_VectorContainingVectors_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VectorTest, VectorContainingVectors) {
  // Representative example of a struct that contains a Vector.
  struct TagAndArray {
    size_t tag;
    Vector<size_t> vec;
  };

  Vector<TagAndArray> vec;
  for (size_t i = 0; i < 100; i++) {
    TagAndArray elem;
    elem.tag = i;
    for (size_t j = 0; j < i; j++) {
      ASSERT_TRUE(elem.vec.Push(j));
    }
    ASSERT_TRUE(vec.Push(std::move(elem)));
  }
  EXPECT_EQ(vec.size(), 100u);

  // Add and remove some element.
  TagAndArray extra;
  extra.tag = 1234;
  ASSERT_TRUE(extra.vec.Push(1234));
  ASSERT_TRUE(vec.Push(std::move(extra)));
  EXPECT_EQ(vec.size(), 101u);
  vec.pop_back();
  EXPECT_EQ(vec.size(), 100u);

  Vector<TagAndArray> vec_moved(std::move(vec));
  EXPECT_EQ(vec_moved.size(), 100u);
  size_t count = 0;
  for (const TagAndArray &elem : vec_moved) {
    // Test the square bracket operator returns the same value as iteration.
    EXPECT_EQ(&elem, &vec_moved[count]);

    EXPECT_EQ(elem.tag, count);
    EXPECT_EQ(elem.vec.size(), count);
    for (size_t j = 0; j < count; j++) {
      EXPECT_EQ(elem.vec[j], j);
    }
    count++;
  }
}